

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O0

ssize_t __thiscall MipsElfFile::write(MipsElfFile *this,int __fd,void *__buf,size_t __n)

{
  Elf32_Off EVar1;
  ElfSegment *this_00;
  ElfSection *this_01;
  MipsElfFile *extraout_RAX;
  undefined4 in_register_00000034;
  int64_t pos;
  ElfSection *sect;
  ElfSegment *seg;
  size_t length_local;
  void *data_local;
  MipsElfFile *this_local;
  
  if (this->segment == -1) {
    if (this->section == -1) {
      Logger::printError<>(Error,"Not inside a section");
      this_local._7_1_ = 0;
      this = extraout_RAX;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_00 = ElfFile::getSegment(&this->elf,(long)this->segment);
    this_01 = ElfSegment::getSection(this_00,(long)this->section);
    EVar1 = ElfSection::getOffset(this_01);
    ElfSegment::writeToData
              (this_00,(ulong)EVar1 + this->sectionOffset,
               (void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    this->sectionOffset = (long)__buf + this->sectionOffset;
    this_local._7_1_ = 1;
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool MipsElfFile::write(void* data, size_t length)
{
	if (segment != -1)
	{
		ElfSegment* seg = elf.getSegment(segment);
		ElfSection* sect = seg->getSection(section);

		int64_t pos = sect->getOffset()+sectionOffset;
		seg->writeToData(pos,data,length);
		sectionOffset += length;
		return true;
	}

	if (section != -1)
	{
		// TODO: segmentless sections
		return false;
	}

	Logger::printError(Logger::Error, "Not inside a section");
	return false;
}